

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTPNAnonFunc * CTcPrsOpUnary::parse_anon_func(int short_form,int is_method)

{
  ushort uVar1;
  int iVar2;
  CTcPrsSymtab *pCVar3;
  CTPNCodeBody *stm;
  CTPNAnonFunc *pCVar4;
  uint self_valid;
  tcprs_codebodytype cb_type;
  CTPNCodeBody *siz;
  CTcParser *pCVar5;
  int err;
  int has_retval;
  CAnonFuncSymtabPrep symprep;
  int local_38;
  byte local_34 [4];
  CAnonFuncSymtabPrep local_30;
  
  cb_type = TCPRS_CB_SHORT_ANON_FN;
  if (short_form == 0) {
    cb_type = ((G_tok->curtok_).typ_ == TOKT_METHOD) + TCPRS_CB_ANON_FN;
  }
  CTcTokenizer::next(G_tok);
  pCVar3 = CAnonFuncSymtabPrep::create_symtab(&local_30);
  local_38 = 0;
  self_valid = 1;
  if (is_method == 0) {
    self_valid = (uint)(G_prs->self_valid_ != 0);
  }
  pCVar4 = (CTPNAnonFunc *)0x0;
  stm = CTcParser::parse_nested_code_body
                  (G_prs,0,self_valid,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
                   (CTcSymLocal **)0x0,(int *)local_34,&local_38,pCVar3,cb_type);
  pCVar5 = G_prs;
  if ((stm != (CTPNCodeBody *)0x0) && (local_38 == 0)) {
    uVar1 = *(ushort *)&(stm->super_CTPNCodeBodyBase).field_0xb8;
    if (is_method == 0) {
      if ((char)uVar1 < '\0') {
        G_prs->self_referenced_ = 1;
        pCVar5->local_ctx_needs_self_ = 1;
        uVar1 = *(ushort *)&(stm->super_CTPNCodeBodyBase).field_0xb8;
      }
      pCVar5 = G_prs;
      if ((uVar1 >> 8 & 1) != 0) {
        G_prs->full_method_ctx_referenced_ = 1;
        pCVar5->local_ctx_needs_full_method_ctx_ = 1;
      }
      CAnonFuncSymtabPrep::finish(&local_30);
      pCVar5 = G_prs;
      if (((G_prs->self_valid_ != 0) &&
          ((*(ushort *)&(stm->super_CTPNCodeBodyBase).field_0xb8 & 0x180) != 0)) &&
         ((G_prs->field_0x1e8 & 1) == 0)) {
        G_prs->field_0x1e8 = G_prs->field_0x1e8 | 1;
        iVar2 = pCVar5->local_cnt_;
        if (pCVar5->max_local_cnt_ <= iVar2) {
          pCVar5->max_local_cnt_ = iVar2 + 1;
        }
        pCVar5->local_cnt_ = iVar2 + 1;
        pCVar5->local_ctx_var_num_ = iVar2;
      }
    }
    else {
      *(ushort *)&(stm->super_CTPNCodeBodyBase).field_0xb8 = uVar1 | 0x400;
      CAnonFuncSymtabPrep::finish(&local_30);
      pCVar5 = G_prs;
    }
    siz = stm;
    CTcParser::add_nested_stm(pCVar5,(CTPNStmTop *)stm);
    pCVar4 = (CTPNAnonFunc *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)siz);
    (pCVar4->super_CTPNAnonFuncBase).code_body_ = stm;
    (pCVar4->super_CTPNAnonFuncBase).field_0x10 =
         (char)is_method * '\x02' & 2U | local_34[0] & 1 |
         (pCVar4->super_CTPNAnonFuncBase).field_0x10 & 0xfc;
    (pCVar4->super_CTPNAnonFuncBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_0031a3f8;
  }
  return pCVar4;
}

Assistant:

CTPNAnonFunc *CTcPrsOpUnary::parse_anon_func(int short_form, int is_method)
{
    /* 
     *   our code body type can be an anonymous function, a short anonymous
     *   function, or an anonymous method 
     */
    tcprs_codebodytype cb_type =
        (short_form ? TCPRS_CB_SHORT_ANON_FN :
         G_tok->cur() == TOKT_METHOD ? TCPRS_CB_ANON_METHOD :
         TCPRS_CB_ANON_FN);

    /* skip the initial token */
    G_tok->next();

    /* prepare the enclosing local symbol table for the new nested scope */
    CAnonFuncSymtabPrep symprep;
    CTcPrsSymtab *lcltab = symprep.create_symtab();

    /* 
     *   Parse the code body.
     *   
     *   If it's a function (not a method), it shares the method context from
     *   the lexically enclosing scope, so it has access to 'self' and other
     *   method context variables if and only if the enclosing scope does.
     *   If it's a method, it has access to the live method context, so the
     *   enclosing scope's status is irrelevant.  
     */
    int err = 0;
    int has_retval;
    CTPNCodeBody *code_body = G_prs->parse_nested_code_body(
        FALSE, is_method ||  G_prs->is_self_valid(),
        0, 0, 0, 0, 0, &has_retval, &err, lcltab, cb_type);

    /* if that failed, return failure */
    if (code_body == 0 || err != 0)
        return 0;

    /* 
     *   If this is an anonymous function (not an anonymous method), and the
     *   nested code body references 'self' or the full method context, then
     *   so does the enclosing code body, and we need these variables in the
     *   local context for the topmost enclosing code body.
     *   
     *   If this is an anonymous method, references to the method context are
     *   to the live frame at the time of invocation, not to the saved
     *   lexical frame at the time of creation.  So references from within
     *   the method's code body don't create references on the enclosing
     *   scope, and they don't require any shared context information.  
     */
    if (!is_method)
    {
        if (code_body->self_referenced())
        {
            G_prs->set_self_referenced(TRUE);
            G_prs->set_local_ctx_needs_self(TRUE);
        }
        if (code_body->full_method_ctx_referenced())
        {
            G_prs->set_full_method_ctx_referenced(TRUE);
            G_prs->set_local_ctx_needs_full_method_ctx(TRUE);
        }
    }
    else
    {
        /* mark it as a method */
        code_body->set_anon_method(TRUE);
    }

    /* finish the symbol table */
    symprep.finish();

    /* 
     *   if this is a function (not a method), and there's a 'self' object in
     *   the enclosing context, and we referenced 'self' or the full method
     *   context in the nested code body, we'll definitely need a local
     *   context, so make sure we have one initialized even if we don't have
     *   any local variables shared 
     */
    if (!is_method
        && G_prs->is_self_valid()
        && (code_body->self_referenced()
            || code_body->full_method_ctx_referenced()))
    {
        /* initialize a local context here, in the enclosing level */
        G_prs->init_local_ctx();
    }

    /* 
     *   add the code body to the parser's master list of nested top-level
     *   statements for the current program 
     */
    G_prs->add_nested_stm(code_body);

    /* return a new anonymous function node */
    return new CTPNAnonFunc(code_body, has_retval, is_method);
}